

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int unres_schema_find(unres_schema *unres,int start_on_backwards,void *item,UNRES_ITEM type)

{
  int iVar1;
  unres_list_uniq *aux_uniq2;
  unres_list_uniq *aux_uniq1;
  int i;
  UNRES_ITEM type_local;
  void *item_local;
  int start_on_backwards_local;
  unres_schema *unres_local;
  
  if (unres->count == 0) {
    unres_local._4_4_ = -1;
  }
  else {
    aux_uniq1._0_4_ = start_on_backwards;
    if (start_on_backwards < 0) {
      aux_uniq1._0_4_ = unres->count - 1;
    }
    for (; -1 < (int)aux_uniq1; aux_uniq1._0_4_ = (int)aux_uniq1 + -1) {
      if (unres->type[(int)aux_uniq1] == type) {
        if (type == UNRES_LIST_UNIQ) {
          if ((*unres->item[(int)aux_uniq1] == *item) &&
             (iVar1 = ly_strequal_(*(char **)((long)unres->item[(int)aux_uniq1] + 8),
                                   *(char **)((long)item + 8)), iVar1 != 0)) break;
        }
        else if (unres->item[(int)aux_uniq1] == item) break;
      }
    }
    unres_local._4_4_ = (int)aux_uniq1;
  }
  return unres_local._4_4_;
}

Assistant:

int
unres_schema_find(struct unres_schema *unres, int start_on_backwards, void *item, enum UNRES_ITEM type)
{
    int i;
    struct unres_list_uniq *aux_uniq1, *aux_uniq2;

    if (!unres->count) {
        return -1;
    }

    if (start_on_backwards >= 0) {
        i = start_on_backwards;
    } else {
        i = unres->count - 1;
    }
    for (; i > -1; i--) {
        if (unres->type[i] != type) {
            continue;
        }
        if (type != UNRES_LIST_UNIQ) {
            if (unres->item[i] == item) {
                break;
            }
        } else {
            aux_uniq1 = (struct unres_list_uniq *)unres->item[i];
            aux_uniq2 = (struct unres_list_uniq *)item;
            if ((aux_uniq1->list == aux_uniq2->list) && ly_strequal(aux_uniq1->expr, aux_uniq2->expr, 0)) {
                break;
            }
        }
    }

    return i;
}